

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O3

matrix3 * matrix3_scalev2(matrix3 *self,vector2 *scale)

{
  anon_union_36_5_d0a4420b_for_matrix3_0 local_2c;
  
  local_2c._4_8_ = 0;
  local_2c.m[3] = 0.0;
  local_2c._20_8_ = 0;
  local_2c._28_8_ = 0x3f80000000000000;
  local_2c.m[0] = (scale->field_0).v[0];
  local_2c.m[4] = (scale->field_0).v[1];
  matrix3_multiply(self,(matrix3 *)&local_2c.field_1);
  return self;
}

Assistant:

HYPAPI struct matrix3 *matrix3_scalev2(struct matrix3 *self, const struct vector2 *scale)
{
	struct matrix3 scalingMatrix;

	return matrix3_multiply(self,
		matrix3_make_transformation_scalingv2(&scalingMatrix, scale));
}